

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

Vec_Int_t * Wlc_NtkCollectObjs(Wlc_Ntk_t *p,int fEven,int *pCount)

{
  int iVar1;
  Vec_Int_t *vObjs_00;
  Wlc_Obj_t *pObj_00;
  undefined4 local_38;
  undefined4 local_34;
  int Count;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vObjs;
  int *pCount_local;
  int fEven_local;
  Wlc_Ntk_t *p_local;
  
  vObjs_00 = Vec_IntAlloc(100);
  local_38 = 0;
  Wlc_NtkCleanMarks(p);
  for (local_34 = 0; iVar1 = Wlc_NtkCoNum(p), (int)local_34 < iVar1; local_34 = local_34 + 1) {
    pObj_00 = Wlc_NtkCo(p,local_34);
    if ((local_34 & 1) == fEven) {
      iVar1 = Wlc_NtkCollectObjs_rec(p,pObj_00,vObjs_00);
      local_38 = iVar1 + local_38;
    }
  }
  Wlc_NtkCleanMarks(p);
  if (pCount != (int *)0x0) {
    *pCount = local_38;
  }
  return vObjs_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectObjs( Wlc_Ntk_t * p, int fEven, int * pCount )
{
    Vec_Int_t * vObjs = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pObj; 
    int i, Count = 0;
    Wlc_NtkCleanMarks( p );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( (i & 1) == fEven )
            Count += Wlc_NtkCollectObjs_rec( p, pObj, vObjs );
    Wlc_NtkCleanMarks( p );
    if ( pCount )
        *pCount = Count;
    return vObjs;
}